

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

int __thiscall libtorrent::aux::torrent::current_stats_state(torrent *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  uVar3 = 0xe2;
  if (((((uint)uVar1 >> 0x1a & 1) == 0) && ((char)this->field_0x5c0 < '\0')) &&
     (uVar3 = 0xda, (this->m_error).failed_ == false)) {
    if ((uVar1 & 0x88000000) == 0) {
      uVar3 = 0xd3;
      if ((uVar1 & 0xe00000000000000) != 0x200000000000000) {
        bVar2 = is_seed(this);
        uVar3 = 0xd7;
        if (!bVar2) {
          bVar2 = is_upload_only(this);
          uVar3 = 0xd6 - bVar2;
        }
      }
    }
    else {
      uVar3 = 0xd4;
      if ((this->field_0x600 & 1) != 0) {
        bVar2 = is_seed(this);
        uVar3 = bVar2 ^ 0xd9;
      }
    }
  }
  return uVar3;
}

Assistant:

int torrent::current_stats_state() const
	{
		if (m_abort || !m_added)
			return counters::num_checking_torrents + no_gauge_state;

		if (has_error()) return counters::num_error_torrents;
		if (m_paused || m_graceful_pause_mode)
		{
			if (!is_auto_managed()) return counters::num_stopped_torrents;
			if (is_seed()) return counters::num_queued_seeding_torrents;
			return counters::num_queued_download_torrents;
		}
		if (state() == torrent_status::checking_files
#if TORRENT_ABI_VERSION == 1
			|| state() == torrent_status::queued_for_checking
#endif
			)
			return counters::num_checking_torrents;
		else if (is_seed()) return counters::num_seeding_torrents;
		else if (is_upload_only()) return counters::num_upload_only_torrents;
		return counters::num_downloading_torrents;
	}